

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void henson::
     Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::load(BinaryBuffer *bb,String *s)

{
  size_t i;
  ulong uVar1;
  char c;
  size_t sz;
  
  (*bb->_vptr_BinaryBuffer[1])(bb,&sz,8);
  std::__cxx11::string::resize((ulong)s);
  for (uVar1 = 0; uVar1 < sz; uVar1 = uVar1 + 1) {
    (*bb->_vptr_BinaryBuffer[1])(bb,&c,1);
    (s->_M_dataplus)._M_p[uVar1] = c;
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, String& s)
    {
      size_t sz;
      henson::load(bb, sz);
      s.resize(sz);
      for (size_t i = 0; i < sz; ++i)
      {
          char c;
          henson::load(bb, c);
          s[i] = c;
      }
    }